

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_HILO(DisasContext_conflict6 *ctx,uint32_t opc,int acc,int reg)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 pTVar1;
  TCGv_i64 pTVar2;
  
  if ((opc & 0xfffffffd) == 0x10 && reg == 0) {
switchD_0087ebde_default:
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  if (acc != 0) {
    check_dsp(ctx);
  }
  switch(opc) {
  case 0x10:
    pTVar2 = tcg_ctx->cpu_gpr[reg];
    if (acc == 0) {
      pTVar1 = tcg_ctx->cpu_HI[0];
      goto LAB_0087ecb6;
    }
    pTVar1 = tcg_ctx->cpu_HI[(uint)acc];
    goto LAB_0087ec4d;
  case 0x11:
    if (reg == 0) {
      pTVar2 = tcg_ctx->cpu_HI[(uint)acc];
LAB_0087ec87:
      tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar2,0);
      return;
    }
    if (acc == 0) {
      pTVar2 = tcg_ctx->cpu_HI[0];
LAB_0087ecab:
      pTVar1 = tcg_ctx->cpu_gpr[reg];
LAB_0087ecb6:
      tcg_gen_mov_i64_mips64el(tcg_ctx,pTVar2,pTVar1);
      return;
    }
    pTVar2 = tcg_ctx->cpu_HI[(uint)acc];
    break;
  case 0x12:
    pTVar2 = tcg_ctx->cpu_gpr[reg];
    if (acc != 0) {
      pTVar1 = tcg_ctx->cpu_LO[(uint)acc];
      goto LAB_0087ec4d;
    }
    pTVar1 = tcg_ctx->cpu_LO[0];
    goto LAB_0087ecb6;
  case 0x13:
    if (reg == 0) {
      pTVar2 = tcg_ctx->cpu_LO[(uint)acc];
      goto LAB_0087ec87;
    }
    if (acc == 0) {
      pTVar2 = tcg_ctx->cpu_LO[0];
      goto LAB_0087ecab;
    }
    pTVar2 = tcg_ctx->cpu_LO[(uint)acc];
    break;
  default:
    goto switchD_0087ebde_default;
  }
  pTVar1 = tcg_ctx->cpu_gpr[reg];
LAB_0087ec4d:
  tcg_gen_ext32s_i64_mips64el(tcg_ctx,pTVar2,pTVar1);
  return;
}

Assistant:

static void gen_HILO(DisasContext *ctx, uint32_t opc, int acc, int reg)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (reg == 0 && (opc == OPC_MFHI || opc == OPC_MFLO)) {
        /* Treat as NOP. */
        return;
    }

    if (acc != 0) {
        check_dsp(ctx);
    }

    switch (opc) {
    case OPC_MFHI:
#if defined(TARGET_MIPS64)
        if (acc != 0) {
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg], tcg_ctx->cpu_HI[acc]);
        } else
#endif
        {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg], tcg_ctx->cpu_HI[acc]);
        }
        break;
    case OPC_MFLO:
#if defined(TARGET_MIPS64)
        if (acc != 0) {
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg], tcg_ctx->cpu_LO[acc]);
        } else
#endif
        {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg], tcg_ctx->cpu_LO[acc]);
        }
        break;
    case OPC_MTHI:
        if (reg != 0) {
#if defined(TARGET_MIPS64)
            if (acc != 0) {
                tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], tcg_ctx->cpu_gpr[reg]);
            } else
#endif
            {
                tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], tcg_ctx->cpu_gpr[reg]);
            }
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], 0);
        }
        break;
    case OPC_MTLO:
        if (reg != 0) {
#if defined(TARGET_MIPS64)
            if (acc != 0) {
                tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_gpr[reg]);
            } else
#endif
            {
                tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_gpr[reg]);
            }
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], 0);
        }
        break;
    }
}